

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::remove_peer(torrent *this,shared_ptr<libtorrent::aux::peer_connection> *p)

{
  _Atomic_word *p_Var1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ulong uVar5;
  peer_list *this_00;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  iterator __position;
  undefined4 extraout_var;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *bitmask;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pptVar11;
  bool bVar12;
  torrent_state st;
  element_type *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e8;
  undefined1 local_e0 [152];
  pointer local_48;
  pointer local_40;
  pointer local_38;
  torrent_peer *peer;
  
  peVar3 = (p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (*(peVar3->super_peer_connection_interface)._vptr_peer_connection_interface[6])
            (local_e0,&peVar3->super_peer_connection_interface);
  __position = ::std::
               _Rb_tree<libtorrent::digest32<160L>,_libtorrent::digest32<160L>,_std::_Identity<libtorrent::digest32<160L>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<libtorrent::digest32<160L>_>_>
               ::find(&(this->m_outgoing_pids)._M_t,(key_type *)local_e0);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header) {
    ::std::
    _Rb_tree<libtorrent::digest32<160l>,libtorrent::digest32<160l>,std::_Identity<libtorrent::digest32<160l>>,std::less<libtorrent::digest32<160l>>,std::allocator<libtorrent::digest32<160l>>>
    ::erase_abi_cxx11_((_Rb_tree<libtorrent::digest32<160l>,libtorrent::digest32<160l>,std::_Identity<libtorrent::digest32<160l>>,std::less<libtorrent::digest32<160l>>,std::allocator<libtorrent::digest32<160l>>>
                        *)&this->m_outgoing_pids,(const_iterator)__position._M_node);
  }
  peVar3 = (p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar10 = (peVar3->super_peer_connection_hot_members).m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (peVar3->super_peer_connection_hot_members).m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_01 = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
    }
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = p_Var4->_M_use_count;
      do {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar7 == 0) break;
        LOCK();
        iVar2 = p_Var4->_M_use_count;
        bVar12 = iVar7 == iVar2;
        if (bVar12) {
          p_Var4->_M_use_count = iVar7 + 1;
          iVar2 = iVar7;
        }
        iVar7 = iVar2;
        UNLOCK();
        this_01 = p_Var4;
      } while (!bVar12);
    }
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar10 = (element_type *)0x0;
  }
  else if (this_01->_M_use_count == 0) {
    peVar10 = (element_type *)0x0;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])(p_Var4);
    }
  }
  if (peVar10 == this) {
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_e0,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    uVar6 = local_e0._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_e0._8_8_ + 0xc) = *(_Atomic_word *)(local_e0._8_8_ + 0xc) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_e0._8_8_ + 0xc) = *(_Atomic_word *)(local_e0._8_8_ + 0xc) + 1;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
    }
    ::std::
    vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
    ::push_back(&this->m_peers_to_disconnect,p);
    iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [7])();
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_f0,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    local_e0._0_8_ = local_f0;
    local_e0._8_8_ = p_Stack_e8;
    local_f0 = (element_type *)0x0;
    p_Stack_e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    deferred_handler::
    post_deferred<libtorrent::aux::handler<libtorrent::aux::torrent,void(libtorrent::aux::torrent::*)()noexcept,&libtorrent::aux::torrent::on_remove_peers,&libtorrent::aux::torrent::on_error,&libtorrent::aux::torrent::on_exception,libtorrent::aux::handler_storage<80ul,(libtorrent::aux::HandlerName)5>,&libtorrent::aux::torrent::m_deferred_handler_storage>>
              (&this->m_deferred_disconnect,(io_context *)CONCAT44(extraout_var_02,iVar7),
               (handler<libtorrent::aux::torrent,_void_(libtorrent::aux::torrent::*)()_noexcept,_&libtorrent::aux::torrent::on_remove_peers,_&libtorrent::aux::torrent::on_error,_&libtorrent::aux::torrent::on_exception,_libtorrent::aux::handler_storage<80UL,_(libtorrent::aux::HandlerName)5>,_&libtorrent::aux::torrent::m_deferred_handler_storage>
                *)local_e0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
    }
    if (p_Stack_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e8);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)(uVar6 + 0xc);
        iVar7 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar7 = *(_Atomic_word *)(uVar6 + 0xc);
        *(int *)(uVar6 + 0xc) = iVar7 + -1;
      }
      if (iVar7 == 1) {
        (*(*(_func_int ***)uVar6)[3])(uVar6);
      }
    }
  }
  else {
    remove_connection(this,(p->
                           super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr);
  }
  iVar7 = (*(((p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[7])();
  peer = (torrent_peer *)CONCAT44(extraout_var,iVar7);
  if ((((this->super_torrent_hot_members).field_0x4b & 2) != 0) &&
     ((this->super_torrent_hot_members).m_picker._M_t.
      super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
      ._M_t.
      super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
      .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
      (piece_picker *)0x0)) {
    bVar12 = peer_connection::is_seed
                       ((p->
                        super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (bVar12) {
      piece_picker::dec_refcount_all
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,peer);
    }
    else {
      bitmask = peer_connection::get_bitfield
                          ((p->
                           super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr);
      piece_picker::dec_refcount
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,bitmask
                 ,peer);
    }
  }
  iVar7 = (*(((p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])();
  if (((char)iVar7 == '\0') &&
     (bVar12 = peer_connection::ignore_unchoke_slots
                         ((p->
                          super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr), !bVar12)) {
    *(uint *)&this->field_0x5d8 =
         *(uint *)&this->field_0x5d8 & 0xff000000 | *(uint *)&this->field_0x5d8 - 1 & 0xffffff;
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x15])
              ();
  }
  if (peer != (torrent_peer *)0x0) {
    if ((*(uint *)&peer->field_0x1b & 0x40) != 0) {
      *(uint *)&peer->field_0x1b = *(uint *)&peer->field_0x1b & 0xffffffbf;
      counters::inc_stats_counter(this->m_stats_counters,0xea,-1);
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x14]
      )();
    }
    iVar7 = (*(((p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])();
    uVar5 = *(ulong *)(CONCAT44(extraout_var_00,iVar7) + 0x20);
    uVar9 = uVar5 + 0x3ff;
    if (-1 < (long)uVar5) {
      uVar9 = uVar5;
    }
    peer->prev_amount_download = peer->prev_amount_download + (int)(uVar9 >> 10);
    iVar7 = (*(((p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])();
    uVar5 = *(ulong *)CONCAT44(extraout_var_01,iVar7);
    uVar9 = uVar5 + 0x3ff;
    if (-1 < (long)uVar5) {
      uVar9 = uVar5;
    }
    peer->prev_amount_upload = peer->prev_amount_upload + (int)(uVar9 >> 10);
    if ((peVar10 == this) && ((peer->field_0x1b & 0x80) != 0)) {
      this->m_num_seeds = this->m_num_seeds - 1;
    }
    if ((peer->connection != (peer_connection_interface *)0x0) &&
       ((this->super_torrent_hot_members).m_peer_list._M_t.
        super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
        ._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
        .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl != (peer_list *)0x0
       )) {
      get_peer_list_state((torrent_state *)local_e0,this);
      this_00 = (this->super_torrent_hot_members).m_peer_list._M_t.
                super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                ._M_t.
                super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
      peVar3 = (p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      uVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0xf])();
      peer_list::connection_closed
                (this_00,&peVar3->super_peer_connection_interface,uVar8 & 0xffff,
                 (torrent_state *)local_e0);
      pptVar11 = local_48;
      if ((this->super_torrent_hot_members).m_picker._M_t.
          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
          ._M_t.
          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
          (piece_picker *)0x0) {
        for (; pptVar11 != local_40; pptVar11 = pptVar11 + 1) {
          piece_picker::clear_peer
                    ((this->super_torrent_hot_members).m_picker._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                     .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                     *pptVar11);
        }
      }
      if (local_48 != (pointer)0x0) {
        operator_delete(local_48,(long)local_38 - (long)local_48);
      }
    }
  }
  peVar3 = (p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (*(peVar3->super_bandwidth_socket)._vptr_bandwidth_socket[6])(peVar3,0);
  update_want_peers(this);
  bVar12 = want_tick(this);
  update_list(this,(torrent_list_index_t)0x1,bVar12);
  return;
}

Assistant:

void torrent::remove_peer(std::shared_ptr<peer_connection> p) noexcept
	{
		TORRENT_ASSERT(p);
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(std::count(m_peers_to_disconnect.begin()
			, m_peers_to_disconnect.end(), p) == 0);

		auto it = m_outgoing_pids.find(p->our_pid());
		if (it != m_outgoing_pids.end())
		{
			m_outgoing_pids.erase(it);
		}

		// only schedule the peer for actual removal if in fact
		// we can be sure peer_connection will be kept alive until
		// the deferred function is called. If a peer_connection
		// has not associated torrent, the session_impl object may
		// remove it at any time, which may be while the non-owning
		// pointer in m_peers_to_disconnect (if added to it) is
		// waiting for the deferred function to be called.
		//
		// one example of this situation is if for example, this
		// function is called from the attach_peer path and fail to
		// do so because of too many connections.
		bool const is_attached = p->associated_torrent().lock().get() == this;
		if (is_attached)
		{
			std::weak_ptr<torrent> weak_t = shared_from_this();
			TORRENT_ASSERT_VAL(m_peers_to_disconnect.capacity() > m_peers_to_disconnect.size()
				, m_peers_to_disconnect.capacity());
			m_peers_to_disconnect.push_back(p);

			using deferred_handler_type = aux::handler<
				torrent
				, decltype(&torrent::on_remove_peers)
				, &torrent::on_remove_peers
				, &torrent::on_error
				, &torrent::on_exception
				, decltype(m_deferred_handler_storage)
				, &torrent::m_deferred_handler_storage
				>;
			static_assert(sizeof(deferred_handler_type) == sizeof(std::shared_ptr<peer_connection>)
				, "deferred handler does not have the expected size");
			m_deferred_disconnect.post_deferred(m_ses.get_context(), deferred_handler_type(shared_from_this()));
		}
		else
		{
			// if the peer was inserted in m_connections but instructed to
			// be removed from this torrent, just remove it from it, see
			// attach_peer logic.
			remove_connection(p.get());
		}

		torrent_peer* pp = p->peer_info_struct();
		if (ready_for_connections())
		{
			TORRENT_ASSERT(p->associated_torrent().lock().get() == nullptr
				|| p->associated_torrent().lock().get() == this);

			if (has_picker())
			{
				if (p->is_seed())
				{
					m_picker->dec_refcount_all(pp);
				}
				else
				{
					auto const& pieces = p->get_bitfield();
					TORRENT_ASSERT(pieces.count() <= pieces.size());
					m_picker->dec_refcount(pieces, pp);
				}
			}
		}

		if (!p->is_choked() && !p->ignore_unchoke_slots())
		{
			--m_num_uploads;
			trigger_unchoke();
		}

		if (pp)
		{
			if (pp->optimistically_unchoked)
			{
				pp->optimistically_unchoked = false;
				m_stats_counters.inc_stats_counter(
					counters::num_peers_up_unchoked_optimistic, -1);
				trigger_optimistic_unchoke();
			}

			TORRENT_ASSERT(pp->prev_amount_upload == 0);
			TORRENT_ASSERT(pp->prev_amount_download == 0);
			pp->prev_amount_download += aux::numeric_cast<std::uint32_t>(p->statistics().total_payload_download() / 1024);
			pp->prev_amount_upload += aux::numeric_cast<std::uint32_t>(p->statistics().total_payload_upload() / 1024);

			// only decrement the seed count if the peer completed attaching to the torrent
			// otherwise the seed count did not get incremented for this peer
			if (is_attached && pp->seed)
			{
				TORRENT_ASSERT(m_num_seeds > 0);
				--m_num_seeds;
			}

			if (pp->connection && m_peer_list)
			{
				torrent_state st = get_peer_list_state();
				m_peer_list->connection_closed(*p, m_ses.session_time(), &st);
				peers_erased(st.erased);
			}
		}

		p->set_peer_info(nullptr);

		update_want_peers();
		update_want_tick();
	}